

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O2

bool dg::pta::PointerAnalysisFSInv::overwriteMOFromFree(MemoryMapT *mm,PSNode *target)

{
  PointsToMapT *this;
  MemoryObject *pMVar1;
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  *this_00;
  size_t sVar2;
  mapped_type *this_01;
  Pointer PVar3;
  const_iterator local_30;
  
  pMVar1 = getOrCreateMO(mm,target);
  this = &pMVar1->pointsTo;
  if ((pMVar1->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    local_30.container_it.
    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
         (__node_type *)0x0;
    this_00 = &std::
               map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
               ::operator[](this,(key_type *)&local_30)->pointers;
    sVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::size(this_00);
    if (sVar2 == 1) {
      ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::begin(&local_30,this_00);
      PVar3 = PointerIdPointsToSet::const_iterator::operator*((const_iterator *)&local_30);
      if (PVar3.target == INVALIDATED) {
        return false;
      }
    }
  }
  std::
  _Rb_tree<dg::Offset,_std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>,_std::_Select1st<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
  ::clear(&this->_M_t);
  local_30.container_it.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)(__node_type *)0x0
  ;
  this_01 = std::
            map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
            ::operator[](this,(key_type *)&local_30);
  PointerIdPointsToSet::add(this_01,INVALIDATED,(Offset)0x0);
  return true;
}

Assistant:

static bool overwriteMOFromFree(MemoryMapT *mm, PSNode *target) {
        // if we know exactly which memory object
        // is being used for freeing the memory,
        // we can set it to invalidated
        auto *mo = getOrCreateMO(mm, target);
        if (mo->pointsTo.size() == 1) {
            auto &S = mo->pointsTo[0];
            if (S.size() == 1 && (*S.begin()).target == INVALIDATED) {
                return false; // no update
            }
        }

        mo->pointsTo.clear();
        mo->pointsTo[0].add(INVALIDATED, 0);
        return true;
    }